

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::UnaryAssertionExpr::serializeTo(UnaryAssertionExpr *this,ASTSerializer *serializer)

{
  bool bVar1;
  ASTSerializer *in_RSI;
  char *in_RDI;
  string_view sVar2;
  ASTSerializer *in_stack_00000008;
  SequenceRange *in_stack_00000010;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,in_RDI);
  sVar2 = ast::toString(Not);
  local_30 = sVar2._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,in_RDI);
  ASTSerializer::write(in_RSI,(int)in_stack_ffffffffffffffc0,local_38,*(size_t *)(in_RDI + 0x18));
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRange> *)0x94bfcc);
  if (bVar1) {
    std::optional<slang::ast::SequenceRange>::operator->
              ((optional<slang::ast::SequenceRange> *)0x94bfe0);
    SequenceRange::serializeTo(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void UnaryAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("expr", expr);
    if (range)
        range->serializeTo(serializer);
}